

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::http::add_to_watchdog(http *this)

{
  element_type *peVar1;
  undefined1 local_40 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (this->in_watchdog_ == false) {
    peVar1 = (this->watchdog_).
             super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    self((http *)local_40);
    std::__weak_ptr<cppcms::impl::cgi::http,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<cppcms::impl::cgi::http,void>
              ((__weak_ptr<cppcms::impl::cgi::http,(__gnu_cxx::_Lock_policy)2> *)(local_40 + 0x10),
               (__shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2> *)local_40);
    std::
    _Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,std::weak_ptr<cppcms::impl::cgi::http>,std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>>,std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>>,std::allocator<std::weak_ptr<cppcms::impl::cgi::http>>>
    ::_M_insert_unique<std::weak_ptr<cppcms::impl::cgi::http>const&>
              ((_Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,std::weak_ptr<cppcms::impl::cgi::http>,std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>>,std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>>,std::allocator<std::weak_ptr<cppcms::impl::cgi::http>>>
                *)&peVar1->connections_,(weak_ptr<cppcms::impl::cgi::http> *)(local_40 + 0x10));
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    this->in_watchdog_ = true;
  }
  return;
}

Assistant:

void add_to_watchdog()
		{
			if(!in_watchdog_) {
				watchdog_->add(self());
				in_watchdog_ = true;
			}
		}